

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

void es::init::singleton<Data<0U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
     active_delete(void)

{
  mutex_type *in_RAX;
  lock_guard<es::init::tc_spin_lock> guard;
  
  std::lock_guard<es::init::tc_spin_lock>::lock_guard
            ((lock_guard<es::init::tc_spin_lock> *)guard._M_device,in_RAX);
  active_delete::active_delete_count = active_delete::active_delete_count + 1;
  Data<0U>::~Data((Data<0U> *)guard._M_device);
  singleton_meta_data_node._p = (void *)0x0;
  std::lock_guard<es::init::tc_spin_lock>::~lock_guard
            ((lock_guard<es::init::tc_spin_lock> *)0x104fd5);
  return;
}

Assistant:

static void active_delete()
    {
        std::lock_guard<tc_spin_lock> guard(singleton_meta_data_node._lock);

        static uint64_t active_delete_count{0};
        ++active_delete_count;
        if constexpr (es::init::verbose_singletons)
        {
            std::cerr << "active_delete - " << __PRETTY_FUNCTION__ << " " << (void*)singleton_meta_data_node._p << " "
                      << active_delete_count << std::endl;
        }
        // call dtor, without releasing memory, which is statically allocated in the union.
        static_cast<T*>(singleton_meta_data_node._p)->~T();
        singleton_meta_data_node._p = nullptr;
    }